

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O0

arena_t * arena_new(tsdn_t *tsdn,uint ind,extent_hooks_t *extent_hooks)

{
  _Bool _Var1;
  byte bVar2;
  dss_prec_t dVar3;
  uint uVar4;
  arena_t *arena_00;
  ulong uVar5;
  uint in_ESI;
  tsdn_t *in_RDI;
  _Bool err;
  uint j;
  uint nshards;
  uintptr_t bin_addr;
  size_t arena_size;
  uint nbins_total;
  uint i;
  base_t *base;
  arena_t *arena;
  pszind_t ind_2;
  pszind_t mod_1;
  size_t delta_inverse_mask_1;
  pszind_t lg_delta_1;
  pszind_t grp_1;
  pszind_t shift_1;
  pszind_t x_1;
  pszind_t ind_1;
  pszind_t mod;
  size_t delta_inverse_mask;
  pszind_t lg_delta;
  pszind_t grp;
  pszind_t shift;
  pszind_t x;
  malloc_mutex_lock_order_t in_stack_fffffffffffffda8;
  witness_rank_t in_stack_fffffffffffffdac;
  undefined4 uVar6;
  char *in_stack_fffffffffffffdb0;
  tsd_t *tsd;
  base_t *in_stack_fffffffffffffdb8;
  undefined4 in_stack_fffffffffffffdc0;
  undefined4 in_stack_fffffffffffffdc4;
  int iVar7;
  int in_stack_fffffffffffffdc8;
  int in_stack_fffffffffffffdcc;
  arena_decay_t *in_stack_fffffffffffffdd0;
  extent_hooks_t *in_stack_fffffffffffffe08;
  undefined8 in_stack_fffffffffffffe10;
  undefined4 in_stack_fffffffffffffe18;
  undefined4 in_stack_fffffffffffffe1c;
  uint uStack_180;
  arena_t *paStack_178;
  uint local_164;
  base_t *local_160;
  
  if (in_ESI == 0) {
    local_160 = b0get();
  }
  else {
    local_160 = base_new((tsdn_t *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),
                         (uint)((ulong)in_stack_fffffffffffffe10 >> 0x20),in_stack_fffffffffffffe08)
    ;
    if (local_160 == (base_t *)0x0) {
      return (arena_t *)0x0;
    }
  }
  for (local_164 = 0; local_164 < 0x24; local_164 = local_164 + 1) {
  }
  arena_00 = (arena_t *)
             base_alloc((tsdn_t *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                        in_stack_fffffffffffffdb8,(size_t)in_stack_fffffffffffffdb0,
                        CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
  if (arena_00 != (arena_t *)0x0) {
    arena_00->nthreads[0].repr = 0;
    arena_00->nthreads[1].repr = 0;
    arena_00->last_thd = (tsdn_t *)0x0;
    _Var1 = arena_stats_init(in_RDI,&arena_00->stats);
    if (!_Var1) {
      (arena_00->tcache_ql).qlh_first = (tcache_t *)0x0;
      (arena_00->cache_bin_array_descriptor_ql).qlh_first = (cache_bin_array_descriptor_t *)0x0;
      _Var1 = malloc_mutex_init((malloc_mutex_t *)in_stack_fffffffffffffdb8,
                                in_stack_fffffffffffffdb0,in_stack_fffffffffffffdac,
                                in_stack_fffffffffffffda8);
      if (!_Var1) {
        (arena_00->offset_state).repr = (size_t)arena_00;
        (arena_00->extent_sn_next).repr = 0;
        dVar3 = extent_dss_prec_get();
        (arena_00->dss_prec).repr = dVar3;
        (arena_00->nactive).repr = 0;
        extent_list_init(&arena_00->large);
        _Var1 = malloc_mutex_init((malloc_mutex_t *)in_stack_fffffffffffffdb8,
                                  in_stack_fffffffffffffdb0,in_stack_fffffffffffffdac,
                                  in_stack_fffffffffffffda8);
        if ((((!_Var1) &&
             (uVar5 = func_0x0010e930(in_RDI,&arena_00->extents_dirty,1), (uVar5 & 1) == 0)) &&
            (uVar5 = func_0x0010e930(in_RDI,&arena_00->extents_muzzy,2,0), (uVar5 & 1) == 0)) &&
           (uVar5 = func_0x0010e930(in_RDI,&arena_00->extents_retained,3,0), (uVar5 & 1) == 0)) {
          arena_dirty_decay_ms_default_get();
          _Var1 = arena_decay_init((arena_decay_t *)in_stack_fffffffffffffdb8,
                                   (ssize_t)in_stack_fffffffffffffdb0,
                                   (arena_stats_decay_t *)
                                   CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
          if (!_Var1) {
            in_stack_fffffffffffffdd0 = &arena_00->decay_muzzy;
            arena_muzzy_decay_ms_default_get();
            _Var1 = arena_decay_init((arena_decay_t *)in_stack_fffffffffffffdb8,
                                     (ssize_t)in_stack_fffffffffffffdb0,
                                     (arena_stats_decay_t *)
                                     CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
            if (!_Var1) {
              uVar4 = lg_floor(0x3fffff);
              if (uVar4 < 0xe) {
                in_stack_fffffffffffffdcc = 0;
              }
              else {
                in_stack_fffffffffffffdcc = uVar4 - 0xe;
              }
              if (uVar4 < 0xf) {
                in_stack_fffffffffffffdc8 = 0xc;
              }
              else {
                in_stack_fffffffffffffdc8 = uVar4 - 3;
              }
              arena_00->extent_grow_next =
                   in_stack_fffffffffffffdcc * 4 +
                   ((uint)((-1L << ((byte)in_stack_fffffffffffffdc8 & 0x3f) & 0x1fffffU) >>
                          ((byte)in_stack_fffffffffffffdc8 & 0x3f)) & 3);
              uVar4 = lg_floor(0xdfffffffffffffff);
              if (uVar4 < 0xe) {
                iVar7 = 0;
              }
              else {
                iVar7 = uVar4 - 0xe;
              }
              if (uVar4 < 0xf) {
                bVar2 = 0xc;
              }
              else {
                bVar2 = (char)uVar4 - 3;
              }
              arena_00->retain_grow_limit =
                   iVar7 * 4 +
                   ((uint)((-1L << (bVar2 & 0x3f) & 0x6fffffffffffffffU) >> (bVar2 & 0x3f)) & 3);
              _Var1 = malloc_mutex_init((malloc_mutex_t *)in_stack_fffffffffffffdb8,
                                        in_stack_fffffffffffffdb0,in_stack_fffffffffffffdac,
                                        in_stack_fffffffffffffda8);
              if (!_Var1) {
                func_0x0010e690(&arena_00->extent_avail);
                _Var1 = malloc_mutex_init((malloc_mutex_t *)in_stack_fffffffffffffdb8,
                                          in_stack_fffffffffffffdb0,in_stack_fffffffffffffdac,
                                          in_stack_fffffffffffffda8);
                if (!_Var1) {
                  paStack_178 = arena_00 + 1;
                  tsd = (tsd_t *)&arena_00->binshard_next;
                  uVar6 = 3;
                  ((atomic_u_t *)tsd)->repr = 0;
                  local_164 = 0;
                  do {
                    if (0x23 < local_164) {
                      arena_00->base = local_160;
                      arena_set(in_ESI,arena_00);
                      nstime_init(&arena_00->create_time,0);
                      nstime_update_impl((nstime_t *)CONCAT44(uVar6,in_stack_fffffffffffffda8));
                      if (in_ESI == 0) {
                        return arena_00;
                      }
                      pre_reentrancy(tsd,(arena_t *)CONCAT44(uVar6,in_stack_fffffffffffffda8));
                      if (test_hooks_arena_new_hook != (_func_void_varargs *)0x0) {
                        (*test_hooks_arena_new_hook)();
                      }
                      post_reentrancy(tsd);
                      return arena_00;
                    }
                    uVar4 = bin_infos[local_164].n_shards;
                    arena_00->bins[local_164].bin_shards = (bin_t *)paStack_178;
                    paStack_178 = (arena_t *)(paStack_178->nthreads + (ulong)uVar4 * 0x46);
                    for (uStack_180 = 0; uStack_180 < uVar4; uStack_180 = uStack_180 + 1) {
                      bVar2 = func_0x0010ec60(arena_00->bins[local_164].bin_shards + uStack_180);
                      if ((bVar2 & 1) != 0) goto LAB_0011e6e6;
                    }
                    local_164 = local_164 + 1;
                  } while( true );
                }
              }
            }
          }
        }
      }
    }
  }
LAB_0011e6e6:
  if (in_ESI != 0) {
    base_delete((tsdn_t *)in_stack_fffffffffffffdd0,
                (base_t *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
  }
  return (arena_t *)0x0;
}

Assistant:

arena_t *
arena_new(tsdn_t *tsdn, unsigned ind, extent_hooks_t *extent_hooks) {
	arena_t *arena;
	base_t *base;
	unsigned i;

	if (ind == 0) {
		base = b0get();
	} else {
		base = base_new(tsdn, ind, extent_hooks);
		if (base == NULL) {
			return NULL;
		}
	}

	unsigned nbins_total = 0;
	for (i = 0; i < SC_NBINS; i++) {
		nbins_total += bin_infos[i].n_shards;
	}
	size_t arena_size = sizeof(arena_t) + sizeof(bin_t) * nbins_total;
	arena = (arena_t *)base_alloc(tsdn, base, arena_size, CACHELINE);
	if (arena == NULL) {
		goto label_error;
	}

	atomic_store_u(&arena->nthreads[0], 0, ATOMIC_RELAXED);
	atomic_store_u(&arena->nthreads[1], 0, ATOMIC_RELAXED);
	arena->last_thd = NULL;

	if (config_stats) {
		if (arena_stats_init(tsdn, &arena->stats)) {
			goto label_error;
		}

		ql_new(&arena->tcache_ql);
		ql_new(&arena->cache_bin_array_descriptor_ql);
		if (malloc_mutex_init(&arena->tcache_ql_mtx, "tcache_ql",
		    WITNESS_RANK_TCACHE_QL, malloc_mutex_rank_exclusive)) {
			goto label_error;
		}
	}

	if (config_prof) {
		if (prof_accum_init(tsdn, &arena->prof_accum)) {
			goto label_error;
		}
	}

	if (config_cache_oblivious) {
		/*
		 * A nondeterministic seed based on the address of arena reduces
		 * the likelihood of lockstep non-uniform cache index
		 * utilization among identical concurrent processes, but at the
		 * cost of test repeatability.  For debug builds, instead use a
		 * deterministic seed.
		 */
		atomic_store_zu(&arena->offset_state, config_debug ? ind :
		    (size_t)(uintptr_t)arena, ATOMIC_RELAXED);
	}

	atomic_store_zu(&arena->extent_sn_next, 0, ATOMIC_RELAXED);

	atomic_store_u(&arena->dss_prec, (unsigned)extent_dss_prec_get(),
	    ATOMIC_RELAXED);

	atomic_store_zu(&arena->nactive, 0, ATOMIC_RELAXED);

	extent_list_init(&arena->large);
	if (malloc_mutex_init(&arena->large_mtx, "arena_large",
	    WITNESS_RANK_ARENA_LARGE, malloc_mutex_rank_exclusive)) {
		goto label_error;
	}

	/*
	 * Delay coalescing for dirty extents despite the disruptive effect on
	 * memory layout for best-fit extent allocation, since cached extents
	 * are likely to be reused soon after deallocation, and the cost of
	 * merging/splitting extents is non-trivial.
	 */
	if (extents_init(tsdn, &arena->extents_dirty, extent_state_dirty,
	    true)) {
		goto label_error;
	}
	/*
	 * Coalesce muzzy extents immediately, because operations on them are in
	 * the critical path much less often than for dirty extents.
	 */
	if (extents_init(tsdn, &arena->extents_muzzy, extent_state_muzzy,
	    false)) {
		goto label_error;
	}
	/*
	 * Coalesce retained extents immediately, in part because they will
	 * never be evicted (and therefore there's no opportunity for delayed
	 * coalescing), but also because operations on retained extents are not
	 * in the critical path.
	 */
	if (extents_init(tsdn, &arena->extents_retained, extent_state_retained,
	    false)) {
		goto label_error;
	}

	if (arena_decay_init(&arena->decay_dirty,
	    arena_dirty_decay_ms_default_get(), &arena->stats.decay_dirty)) {
		goto label_error;
	}
	if (arena_decay_init(&arena->decay_muzzy,
	    arena_muzzy_decay_ms_default_get(), &arena->stats.decay_muzzy)) {
		goto label_error;
	}

	arena->extent_grow_next = sz_psz2ind(HUGEPAGE);
	arena->retain_grow_limit = sz_psz2ind(SC_LARGE_MAXCLASS);
	if (malloc_mutex_init(&arena->extent_grow_mtx, "extent_grow",
	    WITNESS_RANK_EXTENT_GROW, malloc_mutex_rank_exclusive)) {
		goto label_error;
	}

	extent_avail_new(&arena->extent_avail);
	if (malloc_mutex_init(&arena->extent_avail_mtx, "extent_avail",
	    WITNESS_RANK_EXTENT_AVAIL, malloc_mutex_rank_exclusive)) {
		goto label_error;
	}

	/* Initialize bins. */
	uintptr_t bin_addr = (uintptr_t)arena + sizeof(arena_t);
	atomic_store_u(&arena->binshard_next, 0, ATOMIC_RELEASE);
	for (i = 0; i < SC_NBINS; i++) {
		unsigned nshards = bin_infos[i].n_shards;
		arena->bins[i].bin_shards = (bin_t *)bin_addr;
		bin_addr += nshards * sizeof(bin_t);
		for (unsigned j = 0; j < nshards; j++) {
			bool err = bin_init(&arena->bins[i].bin_shards[j]);
			if (err) {
				goto label_error;
			}
		}
	}
	assert(bin_addr == (uintptr_t)arena + arena_size);

	arena->base = base;
	/* Set arena before creating background threads. */
	arena_set(ind, arena);

	nstime_init(&arena->create_time, 0);
	nstime_update(&arena->create_time);

	/* We don't support reentrancy for arena 0 bootstrapping. */
	if (ind != 0) {
		/*
		 * If we're here, then arena 0 already exists, so bootstrapping
		 * is done enough that we should have tsd.
		 */
		assert(!tsdn_null(tsdn));
		pre_reentrancy(tsdn_tsd(tsdn), arena);
		if (test_hooks_arena_new_hook) {
			test_hooks_arena_new_hook();
		}
		post_reentrancy(tsdn_tsd(tsdn));
	}

	return arena;
label_error:
	if (ind != 0) {
		base_delete(tsdn, base);
	}
	return NULL;
}